

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O3

EStatusCode __thiscall
PDFHummus::DocumentContext::EndFormXObjectNoRelease
          (DocumentContext *this,PDFFormXObject *inFormXObject)

{
  _Rb_tree_header *p_Var1;
  ObjectsContext *pOVar2;
  EStatusCode EVar3;
  PDFStream *inStream;
  ObjectIDType inObjectID;
  ResourcesDictionary *inResourcesDictionary;
  _Base_ptr p_Var4;
  iterator __position;
  _Base_ptr *pp_Var5;
  iterator __position_00;
  
  pOVar2 = this->mObjectsContext;
  inStream = PDFFormXObject::GetContentStream(inFormXObject);
  EVar3 = ObjectsContext::EndPDFStream(pOVar2,inStream);
  if (EVar3 == eSuccess) {
    pOVar2 = this->mObjectsContext;
    inObjectID = PDFFormXObject::GetResourcesDictionaryObjectID(inFormXObject);
    EVar3 = ObjectsContext::StartNewIndirectObject(pOVar2,inObjectID);
    if (EVar3 == eSuccess) {
      inResourcesDictionary = PDFFormXObject::GetResourcesDictionary(inFormXObject);
      WriteResourcesDictionary(this,inResourcesDictionary);
      ObjectsContext::EndIndirectObject(this->mObjectsContext);
      p_Var4 = (this->mFormEndTasks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var4 != (_Base_ptr)0x0) {
        p_Var1 = &(this->mFormEndTasks)._M_t._M_impl.super__Rb_tree_header;
        __position._M_node = &p_Var1->_M_header;
        do {
          if (*(PDFFormXObject **)(p_Var4 + 1) >= inFormXObject) {
            __position._M_node = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[*(PDFFormXObject **)(p_Var4 + 1) < inFormXObject];
        } while (p_Var4 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
           (*(PDFFormXObject **)(__position._M_node + 1) <= inFormXObject)) {
          p_Var4 = __position._M_node[1]._M_parent;
          pp_Var5 = &__position._M_node[1]._M_parent;
          if (p_Var4 == (_Base_ptr)pp_Var5) {
            EVar3 = eSuccess;
          }
          else {
            do {
              EVar3 = (**(code **)(*(long *)p_Var4->_M_left + 0x10))
                                (p_Var4->_M_left,inFormXObject,this->mObjectsContext,this);
              if (EVar3 != eSuccess) break;
              p_Var4 = *(_Base_ptr *)p_Var4;
            } while (p_Var4 != (_Base_ptr)pp_Var5);
            p_Var4 = *pp_Var5;
          }
          for (; p_Var4 != (_Base_ptr)pp_Var5; p_Var4 = *(_Base_ptr *)p_Var4) {
            if (p_Var4->_M_left != (_Base_ptr)0x0) {
              (**(code **)(*(long *)p_Var4->_M_left + 8))();
            }
          }
          std::
          _Rb_tree<PDFFormXObject*,std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>,std::_Select1st<std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>>,std::less<PDFFormXObject*>,std::allocator<std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>>>
          ::erase_abi_cxx11_((_Rb_tree<PDFFormXObject*,std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>,std::_Select1st<std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>>,std::less<PDFFormXObject*>,std::allocator<std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>>>
                              *)&this->mFormEndTasks,__position);
          if (EVar3 != eSuccess) {
            return EVar3;
          }
        }
      }
      p_Var4 = (this->mMoreFormEndTasks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      EVar3 = eSuccess;
      if (p_Var4 != (_Base_ptr)0x0) {
        p_Var1 = &(this->mMoreFormEndTasks)._M_t._M_impl.super__Rb_tree_header;
        __position_00._M_node = &p_Var1->_M_header;
        do {
          if (*(PDFFormXObject **)(p_Var4 + 1) >= inFormXObject) {
            __position_00._M_node = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[*(PDFFormXObject **)(p_Var4 + 1) < inFormXObject];
        } while (p_Var4 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)__position_00._M_node != p_Var1) &&
           (EVar3 = eSuccess, *(PDFFormXObject **)(__position_00._M_node + 1) <= inFormXObject)) {
          p_Var4 = __position_00._M_node[1]._M_parent;
          pp_Var5 = &__position_00._M_node[1]._M_parent;
          if (p_Var4 == (_Base_ptr)pp_Var5) {
            EVar3 = eSuccess;
          }
          else {
            do {
              EVar3 = (**(code **)(*(long *)p_Var4->_M_left + 0x10))
                                (p_Var4->_M_left,this->mObjectsContext,this);
              if (EVar3 != eSuccess) break;
              p_Var4 = *(_Base_ptr *)p_Var4;
            } while (p_Var4 != (_Base_ptr)pp_Var5);
            p_Var4 = *pp_Var5;
          }
          for (; p_Var4 != (_Base_ptr)pp_Var5; p_Var4 = *(_Base_ptr *)p_Var4) {
            if (p_Var4->_M_left != (_Base_ptr)0x0) {
              (**(code **)(*(long *)p_Var4->_M_left + 8))();
            }
          }
          std::
          _Rb_tree<PDFFormXObject*,std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>,std::_Select1st<std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>>,std::less<PDFFormXObject*>,std::allocator<std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>>>
          ::erase_abi_cxx11_((_Rb_tree<PDFFormXObject*,std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>,std::_Select1st<std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>>,std::less<PDFFormXObject*>,std::allocator<std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>>>
                              *)&this->mMoreFormEndTasks,__position_00);
        }
      }
    }
  }
  return EVar3;
}

Assistant:

EStatusCode DocumentContext::EndFormXObjectNoRelease(PDFFormXObject* inFormXObject)
{
	EStatusCode status = mObjectsContext->EndPDFStream(inFormXObject->GetContentStream());
	if(status != eSuccess)
		return status;

	// now write the resources dictionary, full of all the goodness that got accumulated over the stream write
	status = mObjectsContext->StartNewIndirectObject(inFormXObject->GetResourcesDictionaryObjectID());
	if(status != eSuccess)
		return status;
	WriteResourcesDictionary(inFormXObject->GetResourcesDictionary());
	mObjectsContext->EndIndirectObject();

    // now write writing tasks
	{
		PDFFormXObjectToIFormEndWritingTaskListMap::iterator it= mFormEndTasks.find(inFormXObject);

		if(it != mFormEndTasks.end())
		{
			IFormEndWritingTaskList::iterator itTasks = it->second.begin();

			for(; itTasks != it->second.end() && eSuccess == status; ++itTasks)
				status = (*itTasks)->Write(inFormXObject,mObjectsContext,this);

			// one time, so delete
			for(itTasks = it->second.begin(); itTasks != it->second.end(); ++itTasks)
				delete (*itTasks);
			mFormEndTasks.erase(it);
		}

	}
	if(status != eSuccess)
		return status;


	// and more writing tasks
	{
		PDFFormXObjectToIObjectEndWritingTaskListMap::iterator it= mMoreFormEndTasks.find(inFormXObject);

		if(it != mMoreFormEndTasks.end())
		{
			IObjectEndWritingTaskList::iterator itTasks = it->second.begin();

			for(; itTasks != it->second.end() && eSuccess == status; ++itTasks)
				status = (*itTasks)->Write(mObjectsContext,this);

			// one time, so delete
			for(itTasks = it->second.begin(); itTasks != it->second.end(); ++itTasks)
				delete (*itTasks);
			mMoreFormEndTasks.erase(it);
		}		
	}

	return status;
}